

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

bool __thiscall graph::isEdge(graph *this,restaurant *from,restaurant *to)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *__x;
  size_type sVar4;
  reference pvVar5;
  bool local_79;
  int local_64;
  undefined1 local_60 [4];
  int i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adj;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  restaurant *local_28;
  restaurant *to_local;
  restaurant *from_local;
  graph *this_local;
  
  local_28 = to;
  to_local = from;
  from_local = (restaurant *)this;
  pmVar3 = std::
           unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
           ::operator[](&this->mapper,&to_local);
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->v,pmVar3);
  local_38._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->v);
  bVar2 = std::operator==(&local_30,&local_38);
  local_79 = true;
  if (!bVar2) {
    pmVar3 = std::
             unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
             ::operator[](&this->mapper,&local_28);
    local_40._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->v,pmVar3);
    adj.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->v);
    local_79 = std::operator==(&local_40,
                               (_Self *)&adj.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_79 == false) {
    pmVar3 = std::
             unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
             ::operator[](&this->mapper,&to_local);
    __x = std::
          unordered_map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::operator[](&this->theGraph,pmVar3);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_60,__x);
    local_64 = 0;
    while( true ) {
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_60);
      if (sVar4 <= (ulong)(long)local_64) break;
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_60,(long)local_64);
      iVar1 = pvVar5->first;
      pmVar3 = std::
               unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
               ::operator[](&this->mapper,&local_28);
      if (iVar1 == *pmVar3) {
        this_local._7_1_ = 1;
        goto LAB_0011663e;
      }
      local_64 = local_64 + 1;
    }
    this_local._7_1_ = 0;
LAB_0011663e:
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_60);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool graph::isEdge(restaurant *from, restaurant *to)
{
    if (v.find(mapper[from]) == v.end() || v.find(mapper[to]) == v.end())
    {
        return false;
    }
    vector<pair<int, int>> adj = theGraph[mapper[from]];
    for (int i = 0; i < adj.size(); i++)
    {
        if (adj[i].first == mapper[to])
        {
            return true;
        }
    }
    return false;
}